

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
Compiler::processVariable
          (Compiler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *line)

{
  Parser *this_00;
  InstructionGenerator *pIVar1;
  pointer pSVar2;
  pointer pbVar3;
  pointer pbVar4;
  bool bVar5;
  DataType type;
  DataType varType;
  uint uVar6;
  ostream *poVar7;
  unsigned_long_long uVar8;
  ulong uVar9;
  Variable *pVVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  uint __val;
  uint uVar12;
  string *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  string arrayName;
  string args;
  string arraySize;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  type = stringToDataType((line->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start);
  if ((type == UNKNOWN) &&
     (bVar5 = std::operator!=((line->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start,"auto"), bVar5)) {
    bVar5 = std::operator==((line->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,"=");
    if (bVar5) {
      Parser::combineArguments
                (&arrayName,&this->parser,line,2,
                 (int)((ulong)((long)(line->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(line->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 5) - 2);
      std::operator+(&args,"(",&arrayName);
      std::operator+(&local_b0,&args,")");
      evaluateBracket(this,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&args);
      std::__cxx11::string::~string((string *)&arrayName);
    }
    else {
      pIVar1 = &this->igen;
      InstructionGenerator::genCloneTop
                (pIVar1,(line->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start);
      Parser::combineArguments
                (&arrayName,&this->parser,line,2,
                 (int)((ulong)((long)(line->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(line->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 5) - 2);
      std::operator+(&args,"(",&arrayName);
      std::operator+(&local_d0,&args,")");
      evaluateBracket(this,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&args);
      std::__cxx11::string::~string((string *)&arrayName);
      bVar5 = std::operator==((line->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1,"*=");
      if (bVar5) {
        InstructionGenerator::genMathMultiply(pIVar1,2);
      }
      else {
        bVar5 = std::operator==((line->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1,"/=");
        if (bVar5) {
          InstructionGenerator::genMathDivide(pIVar1,2);
        }
        else {
          bVar5 = std::operator==((line->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1,"%=");
          if (bVar5) {
            InstructionGenerator::genMathModulus(pIVar1,2);
          }
          else {
            bVar5 = std::operator==((line->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 1,"+=");
            if (bVar5) {
              InstructionGenerator::genMathAdd(pIVar1,2);
            }
            else {
              bVar5 = std::operator==((line->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 1,"-=");
              if (bVar5) {
                InstructionGenerator::genMathSubtract(pIVar1,2);
              }
              else {
                bVar5 = std::operator==((line->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 1,"@=");
                if (bVar5) {
                  InstructionGenerator::genConcentrateStrings(pIVar1,2);
                }
              }
            }
          }
        }
      }
    }
    InstructionGenerator::genSetVariable
              (&this->igen,
               (line->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start);
    return;
  }
  varType = stringToDataType((line->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
  pSVar2 = (this->openScopeStack).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (((this->openScopeStack).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
       super__Vector_impl_data._M_start == pSVar2) || (pSVar2[-1].type != CLASS)) {
    pbVar3 = (line->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (line->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    this_00 = &this->parser;
    bVar5 = Parser::isArrayDefinition(this_00,pbVar3 + 1);
    if (0x40 < (ulong)((long)pbVar4 - (long)pbVar3)) {
      if (!bVar5) {
        pIVar1 = &this->igen;
        VirtualStack::getStackSize(&pIVar1->super_VirtualStack);
        Parser::combineArguments
                  (&local_90,this_00,line,3,
                   (int)((ulong)((long)(line->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(line->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 5) - 3);
        evaluateBracket(this,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        VirtualStack::getStackSize(&pIVar1->super_VirtualStack);
        uVar12 = VirtualStack::getStackSize(&pIVar1->super_VirtualStack);
        VirtualStack::renameVariable
                  (&pIVar1->super_VirtualStack,uVar12 - 1,
                   (line->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 1);
        return;
      }
      Parser::combineArguments
                (&local_50,this_00,line,3,
                 (int)((ulong)((long)(line->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(line->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 5) - 3);
      Parser::extractBracketArguments(&local_238,this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::
      __reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (local_238.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_238.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      args._M_dataplus._M_p = (pointer)&args.field_2;
      args._M_string_length = 0;
      args.field_2._M_local_buf[0] = '\0';
      for (uVar12 = 0;
          (ulong)uVar12 <
          (ulong)((long)local_238.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_238.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5); uVar12 = uVar12 + 1) {
        std::__cxx11::string::append((string *)&args);
        if (((long)local_238.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_238.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U != (ulong)uVar12) {
          std::__cxx11::string::append((char *)&args);
        }
      }
      pIVar1 = &this->igen;
      uVar12 = VirtualStack::getStackSize(&pIVar1->super_VirtualStack);
      std::__cxx11::string::string((string *)&local_f0,(string *)&args);
      evaluateBracket(this,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      uVar6 = VirtualStack::getStackSize(&pIVar1->super_VirtualStack);
      arrayName._M_dataplus._M_p = (pointer)&arrayName.field_2;
      arrayName._M_string_length = 0;
      arraySize._M_dataplus._M_p = (pointer)&arraySize.field_2;
      arraySize._M_string_length = 0;
      arrayName.field_2._M_local_buf[0] = '\0';
      arraySize.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string
                ((string *)&local_110,
                 (string *)
                 ((line->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + 1));
      Parser::splitArrayDefinition(this_00,&local_110,&arrayName,&arraySize);
      std::__cxx11::string::~string((string *)&local_110);
      if (arraySize._M_string_length == 0) {
        uVar9 = (long)local_238.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_238.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        uVar8 = uVar9;
      }
      else {
        uVar8 = std::__cxx11::stoull(&arraySize,(size_t *)0x0,10);
        uVar9 = (long)local_238.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_238.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
      }
      __val = (uint)uVar8;
      if (uVar9 <= (uVar8 & 0xffffffff)) {
        if (uVar6 - uVar12 == __val) {
          uVar12 = VirtualStack::getStackSize(&pIVar1->super_VirtualStack);
          VirtualStack::renameVariable(&pIVar1->super_VirtualStack,uVar12 - __val,&arrayName);
          std::__cxx11::string::string((string *)&local_130,(string *)&arrayName);
          uVar12 = VirtualStack::isVariable(&pIVar1->super_VirtualStack,&local_130);
          pVVar10 = VirtualStack::getVariable(&pIVar1->super_VirtualStack,uVar12);
          std::__cxx11::string::~string((string *)&local_130);
          pVVar10->arrayLength = __val;
          pVVar10->isArray = true;
          std::__cxx11::string::~string((string *)&arraySize);
          std::__cxx11::string::~string((string *)&arrayName);
          std::__cxx11::string::~string((string *)&args);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_238);
          return;
        }
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __cxa_allocate_exception(0x20);
        std::__cxx11::to_string(&local_1b0,uVar6 - uVar12);
        std::operator+(&local_190,"Invalid array initialiser arguments. Got ",&local_1b0);
        std::operator+(&local_170,&local_190,", expected ");
        std::operator+(pbVar11,&local_170,&arraySize);
        __cxa_throw(pbVar11,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __cxa_allocate_exception(0x20);
      std::__cxx11::to_string(&local_1b0,__val);
      std::operator+(&local_190,
                     "Array initialiser contains too many elements for the array to hold. Array size: "
                     ,&local_1b0);
      std::operator+(&local_170,&local_190,". List size: ");
      std::__cxx11::to_string
                (&local_70,
                 (long)local_238.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_238.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      std::operator+(pbVar11,&local_170,&local_70);
      __cxa_throw(pbVar11,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    if (!bVar5) {
      InstructionGenerator::genCreateDefaultValue
                (&this->igen,
                 (line->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1,type);
      return;
    }
    args._M_dataplus._M_p = (pointer)&args.field_2;
    args._M_string_length = 0;
    arrayName._M_dataplus._M_p = (pointer)&arrayName.field_2;
    arrayName._M_string_length = 0;
    args.field_2._M_local_buf[0] = '\0';
    arrayName.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string
              ((string *)&local_150,
               (string *)
               ((line->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 1));
    Parser::splitArrayDefinition(this_00,&local_150,&args,&arrayName);
    std::__cxx11::string::~string((string *)&local_150);
    InstructionGenerator::genCreateArray(&this->igen,&args,&arrayName,type);
    std::__cxx11::string::~string((string *)&arrayName);
    this_01 = &args;
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,"\nVar in class: ");
    std::operator<<(poVar7,(string *)
                           ((line->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1));
    pSVar2 = (this->pastScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
             super__Vector_impl_data._M_finish;
    Variable::Variable((Variable *)&args,
                       (line->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1,varType);
    std::vector<Variable,_std::allocator<Variable>_>::emplace_back<Variable>
              (&pSVar2[-1].childDataMembers,(Variable *)&args);
    this_01 = (string *)&args._M_string_length;
  }
  std::__cxx11::string::~string((string *)this_01);
  return;
}

Assistant:

void Compiler::processVariable(const std::vector<std::string>& line) //things like "int a = 20"
{
    DataType possibleType = stringToDataType(line[0]);
    if(possibleType == DataType::UNKNOWN && line[0] != "auto") //If we're not creating a new variable (eg a = 20)
    {
        if(line[1] == "=") //If it's a set operation
        {
            //Evaluate the bracket containing what the variable should be set to
            evaluateBracket("(" + parser.combineArguments(line, 2, line.size() - 2) + ")");
        }
        else //Else if it's a math operation
        {
            //First move the variable data that we're operating on to the top of the stack
            igen.genCloneTop(line[0]);

            //Evaluate the bracket containing what the variable should be set to
            evaluateBracket("(" + parser.combineArguments(line, 2, line.size() - 2) + ")");

            //Do different things depending on the assignment operator
            if(line[1] == "*=")
            {
                igen.genMathMultiply(2);
            }
            else if(line[1] == "/=")
            {
                igen.genMathDivide(2);
            }
            else if(line[1] == "%=")
            {
                //Divide the last two things on the stack (the bracket and the variable)
                igen.genMathModulus(2);
            }
            else if(line[1] == "+=")
            {
                igen.genMathAdd(2);
            }
            else if(line[1] == "-=")
            {
                igen.genMathSubtract(2);
            }
            else if(line[1] == "@=")
            {
                igen.genConcentrateStrings(2);
            }
        }

        //Set the variable to the last thing on the stack
        igen.genSetVariable(line[0]);
    }
    else //If we're creating a new variable (eg int a = 20)
    {
        //Convert its data type from string to enum
        DataType type = stringToDataType(line[0]);

        if(!openScopeStack.empty() && openScopeStack.back().type == Scope::CLASS) //We're defining class members, so don't actually create them. Just register to the class.
        {
            std::cout << "\nVar in class: " << line[1];
            //NOTE TO SELF: ADD BRACKET INITIALISATION EVALUATION
            pastScopes.back().childDataMembers.emplace_back(Variable(line[1], type));
        }
        else //If we're not in a class, create the variables immediately
        {
            if(line.size() > 2) //If there's a value provided (int a = 20)
            {
                if(parser.isArrayDefinition(line[1])) //Check if it's an array definition
                {
                    //Flip argument list for left->right parsing
                    std::vector<std::string> &&arguments = parser.extractBracketArguments(parser.combineArguments(line, 3, line.size() - 3));
                    std::reverse(arguments.begin(), arguments.end());
                    std::string args;
                    for(unsigned int a = 0; a < arguments.size(); a++)
                    {
                        args += arguments[a];
                        if(a != arguments.size()-1)
                            args += ", ";
                    }

                    //Evaluate value to set it to and name the variable
                    unsigned int stackSizePrior = igen.getStackSize();

                    evaluateBracket(args);
                    unsigned int stackSizeAfter = igen.getStackSize();

                    //Split array definition into name and size
                    std::string arrayName;
                    std::string arraySize;
                    parser.splitArrayDefinition(line[1], arrayName, arraySize);

                    //Find how large to make it. Pick the size specified in the brackets if it's there, otherwise the number of elements in the initialiser list
                    unsigned int arraySizeCasted = 0;
                    if(!arraySize.empty())
                        arraySizeCasted = std::stoull(arraySize);
                    else
                        arraySizeCasted = (unsigned int)arguments.size();

                    //Check that the number of arguments in the initialiser list is smaller than the array size
                    if(arraySizeCasted < arguments.size())
                    {
                        throw std::string("Array initialiser contains too many elements for the array to hold. Array size: " + std::to_string(arraySizeCasted) + ". List size: " + std::to_string(arguments.size()));
                    }

                    if(arraySizeCasted != stackSizeAfter - stackSizePrior)
                    {
                        throw std::string("Invalid array initialiser arguments. Got " + std::to_string(stackSizeAfter - stackSizePrior) + ", expected " + arraySize);
                    }

                    //Name the created variables compiler side
                    igen.renameVariable(igen.getStackSize() - arraySizeCasted, arrayName);
                    Variable &var = igen.getVariable(igen.isVariable(arrayName));
                    var.arrayLength = arraySizeCasted;
                    var.isArray = true;
                }
                else
                {
                    //Evaluate value to set it to and name the variable
                    unsigned int stackSizePrior = igen.getStackSize();
                    evaluateBracket(parser.combineArguments(line, 3, line.size() - 3));
                    unsigned int stackSizeAfter = igen.getStackSize();

                    //Rename variable compiler side
                    igen.renameVariable(igen.getStackSize()-1, line[1]);
                }
            }
            else //Else no default value provided (int a)
            {
                if(parser.isArrayDefinition(line[1])) //Check if it's an array definition
                {
                    //Split array definition into name and size
                    std::string arrayName;
                    std::string arraySize;
                    parser.splitArrayDefinition(line[1], arrayName, arraySize);

                    //Create the array
                    igen.genCreateArray(arrayName, arraySize, possibleType);
                }
                else
                {
                    igen.genCreateDefaultValue(line[1], possibleType);
                }
            }
        }
    }
    return;
}